

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  bool bVar1;
  reference pvVar2;
  reference base;
  ExportModuleField *pEVar3;
  ModuleFieldList *__range2;
  iterator rhs;
  iterator __begin2;
  Location last_field_loc;
  iterator local_a8;
  Location local_98;
  Var local_78;
  
  pvVar2 = intrusive_list<wabt::ModuleField>::back(&module->fields);
  local_98.filename._M_len = (pvVar2->loc).filename._M_len;
  local_98.filename._M_str = (pvVar2->loc).filename._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (pvVar2->loc).field_1.field_1.offset;
  local_98.field_1._8_8_ = *(undefined8 *)((long)&(pvVar2->loc).field_1 + 8);
  local_a8.node_ = fields->first_;
  local_a8.list_ = fields;
  while( true ) {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = fields;
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=(&local_a8,rhs);
    if (!bVar1) break;
    base = intrusive_list<wabt::ModuleField>::iterator::operator*(&local_a8);
    pEVar3 = cast<wabt::ExportModuleField,wabt::ModuleField>(base);
    Var::Var(&local_78,index,&local_98);
    Var::operator=(&(pEVar3->export_).var,&local_78);
    Var::~Var(&local_78);
    intrusive_list<wabt::ModuleField>::iterator::operator++(&local_a8);
  }
  Module::AppendFields(module,fields);
  return;
}

Assistant:

void AppendInlineExportFields(Module* module,
                              ModuleFieldList* fields,
                              Index index) {
  Location last_field_loc = module->fields.back().loc;

  for (ModuleField& field : *fields) {
    auto* export_field = cast<ExportModuleField>(&field);
    export_field->export_.var = Var(index, last_field_loc);
  }

  module->AppendFields(fields);
}